

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_GenOneHotIntervals(char *pFileName,int nPis,int nRegs,Vec_Ptr_t *vOnehots)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  void *pvVar5;
  undefined4 extraout_var;
  Vec_Int_t *p;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int i;
  int i_00;
  int i_01;
  uint uVar9;
  uint local_54;
  
  __stream = fopen(pFileName,"w");
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness with %d vars and %d regs generated by ABC on %s\n",
          (ulong)(uint)nPis,(ulong)(uint)nRegs,pcVar4);
  fprintf(__stream,"# Used %d intervals of 1-hot registers: { ",(ulong)(uint)vOnehots->nSize);
  local_54 = 0;
  for (iVar7 = 0; iVar7 < vOnehots->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(vOnehots,iVar7);
    fprintf(__stream,"%d ",(ulong)*(uint *)((long)pvVar5 + 4));
    local_54 = local_54 + ((*(int *)((long)pvVar5 + 4) + -1) * *(int *)((long)pvVar5 + 4)) / 2;
  }
  fwrite("}\n",2,1,__stream);
  fprintf(__stream,".model 1hot_%dvars_%dregs\n",(ulong)(uint)nPis,(ulong)(uint)nRegs);
  fwrite(".inputs",7,1,__stream);
  uVar9 = nRegs + nPis;
  uVar1 = Abc_Base10Log(uVar9);
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    fprintf(__stream," i%0*d",(ulong)uVar1,(ulong)uVar8);
  }
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  iVar7 = Abc_Base10Log(local_54);
  uVar9 = 0;
  if (0 < (int)local_54) {
    uVar9 = local_54;
  }
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    fprintf(__stream," o%0*d",CONCAT44(extraout_var,iVar7),(ulong)uVar8);
  }
  fputc(10,__stream);
  uVar6 = 0;
  for (i_01 = 0; i_01 < vOnehots->nSize; i_01 = i_01 + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vOnehots,i_01);
    iVar3 = p->nSize;
    i = 0;
    while (i < iVar3) {
      iVar2 = Vec_IntEntry(p,i);
      i = i + 1;
      for (i_00 = i; iVar3 = p->nSize, i_00 < iVar3; i_00 = i_00 + 1) {
        iVar3 = Vec_IntEntry(p,i_00);
        fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar1,(ulong)(uint)(iVar2 + nPis),
                (ulong)uVar1,(ulong)(uint)(iVar3 + nPis),CONCAT44(extraout_var,iVar7),uVar6);
        fwrite("11 0\n",5,1,__stream);
        uVar6 = (ulong)((int)uVar6 + 1);
      }
    }
  }
  if (local_54 != (uint)uVar6) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcGen.c"
                  ,0x2a6,"void Abc_GenOneHotIntervals(char *, int, int, Vec_Ptr_t *)");
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vLine;
    FILE * pFile;
    int i, j, k, iReg1, iReg2, Counter, Counter2, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness with %d vars and %d regs generated by ABC on %s\n", nPis, nRegs, Extra_TimeStamp() );
    fprintf( pFile, "# Used %d intervals of 1-hot registers: { ", Vec_PtrSize(vOnehots) );
    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        fprintf( pFile, "%d ", Vec_IntSize(vLine) );
        Counter += Vec_IntSize(vLine) * (Vec_IntSize(vLine) - 1) / 2;
    }
    fprintf( pFile, "}\n" );
    fprintf( pFile, ".model 1hot_%dvars_%dregs\n", nPis, nRegs );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nPis+nRegs );
    for ( i = 0; i < nPis+nRegs; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( Counter );
    for ( i = 0; i < Counter; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter2 = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        Vec_IntForEachEntry( vLine, iReg1, i )
        Vec_IntForEachEntryStart( vLine, iReg2, j, i+1 )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, nPis+iReg1, nDigitsIn, nPis+iReg2, nDigitsOut, Counter2 ); 
            fprintf( pFile, "11 0\n" ); 
            Counter2++;
        }
    }
    assert( Counter == Counter2 );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}